

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureStateQueryTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::TextureStateQueryTests::init
          (TextureStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  RenderContext *pRVar2;
  bool bVar3;
  undefined4 uVar4;
  TestNode *pTVar5;
  TestNode *pTVar6;
  long *plVar7;
  long lVar8;
  ulong *puVar9;
  size_type *psVar10;
  TesterType tester;
  GLenum target;
  QueryType QVar11;
  bool bVar12;
  allocator<char> local_ea;
  char local_e9;
  string local_e8;
  string local_c8;
  anon_struct_24_4_699f403a *local_a8;
  string local_a0;
  TestNode *local_80;
  TestNode *local_78;
  string local_70;
  TestNode *local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  lVar8 = 0;
  local_78 = (TestNode *)this;
  do {
    pTVar6 = local_78;
    pTVar5 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,pTVar6->m_testCtx,init::textureTargets[lVar8].name,
               init::textureTargets[lVar8].name);
    tcu::TestNode::addChild(pTVar6,pTVar5);
    local_e9 = init::textureTargets[lVar8].newInGLES31;
    local_50 = pTVar5;
    local_40 = lVar8;
    if ((bool)local_e9 == false) {
      local_80 = (TestNode *)CONCAT44(local_80._4_4_,init::textureTargets[lVar8].target);
    }
    else {
      pTVar1 = pTVar6->m_testCtx;
      pRVar2 = (RenderContext *)pTVar6[1]._vptr_TestNode[1];
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"is_texture","");
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"IsTexture","");
      local_80 = (TestNode *)CONCAT44(local_80._4_4_,init::textureTargets[lVar8].target);
      pTVar6 = &deqp::gls::TextureStateQueryTests::createIsTextureTest
                          (pTVar1,pRVar2,&local_c8,&local_e8,init::textureTargets[lVar8].target)->
                super_TestNode;
      tcu::TestNode::addChild(pTVar5,pTVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    lVar8 = 0;
    do {
      local_48 = (ulong)init::states[lVar8].tester;
      local_38 = lVar8;
      bVar3 = deqp::gls::TextureStateQueryTests::isLegalTesterForTarget
                        ((GLenum)local_80,init::states[lVar8].tester);
      if ((bVar3) &&
         ((local_a8 = init::states + lVar8, local_e9 != '\0' ||
          (init::states[lVar8].newInGLES31 == true)))) {
        if ((int)local_48 - 0x36U < 3) {
          lVar8 = 0;
          bVar3 = true;
          do {
            bVar12 = bVar3;
            QVar11 = init()::nonPureVerifiers[lVar8];
            pTVar1 = local_78->m_testCtx;
            pRVar2 = (RenderContext *)local_78[1]._vptr_TestNode[1];
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            local_a0._M_string_length = 0;
            local_a0.field_2._M_local_buf[0] = '\0';
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_a0);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            puVar9 = (ulong *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar9) {
              local_e8.field_2._M_allocated_capacity = *puVar9;
              local_e8.field_2._8_8_ = plVar7[3];
            }
            else {
              local_e8.field_2._M_allocated_capacity = *puVar9;
              local_e8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_e8._M_string_length = plVar7[1];
            *plVar7 = (long)puVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_e8);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            psVar10 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_c8.field_2._M_allocated_capacity = *psVar10;
              local_c8.field_2._8_8_ = plVar7[3];
            }
            else {
              local_c8.field_2._M_allocated_capacity = *psVar10;
              local_c8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_c8._M_string_length = plVar7[1];
            *plVar7 = (long)psVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,local_a8->desc,&local_ea);
            pTVar6 = &deqp::gls::TextureStateQueryTests::createTexParamTest
                                (pTVar1,pRVar2,&local_c8,&local_70,QVar11,(GLenum)local_80,
                                 (TesterType)local_48)->super_TestNode;
            tcu::TestNode::addChild(local_50,pTVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,
                              CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                       local_a0.field_2._M_local_buf[0]) + 1);
            }
            lVar8 = 1;
            bVar3 = false;
          } while (bVar12);
        }
        else if ((int)local_48 == 0x35) {
          lVar8 = 0;
          do {
            QVar11 = *(QueryType *)((long)init::vec4Verifiers + lVar8);
            pTVar1 = local_78->m_testCtx;
            pRVar2 = (RenderContext *)local_78[1]._vptr_TestNode[1];
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            local_a0._M_string_length = 0;
            local_a0.field_2._M_local_buf[0] = '\0';
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_a0);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            puVar9 = (ulong *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar9) {
              local_e8.field_2._M_allocated_capacity = *puVar9;
              local_e8.field_2._8_8_ = plVar7[3];
            }
            else {
              local_e8.field_2._M_allocated_capacity = *puVar9;
              local_e8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_e8._M_string_length = plVar7[1];
            *plVar7 = (long)puVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_e8);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            psVar10 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_c8.field_2._M_allocated_capacity = *psVar10;
              local_c8.field_2._8_8_ = plVar7[3];
            }
            else {
              local_c8.field_2._M_allocated_capacity = *psVar10;
              local_c8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_c8._M_string_length = plVar7[1];
            *plVar7 = (long)psVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,local_a8->desc,&local_ea);
            pTVar6 = &deqp::gls::TextureStateQueryTests::createTexParamTest
                                (pTVar1,pRVar2,&local_c8,&local_70,QVar11,(GLenum)local_80,
                                 TESTER_TEXTURE_BORDER_COLOR)->super_TestNode;
            tcu::TestNode::addChild(local_50,pTVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,
                              CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                       local_a0.field_2._M_local_buf[0]) + 1);
            }
            lVar8 = lVar8 + 4;
          } while (lVar8 != 0x10);
        }
        else {
          lVar8 = 0;
          do {
            QVar11 = *(QueryType *)((long)init::scalarVerifiers + lVar8);
            pTVar1 = local_78->m_testCtx;
            pRVar2 = (RenderContext *)local_78[1]._vptr_TestNode[1];
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            local_a0._M_string_length = 0;
            local_a0.field_2._M_local_buf[0] = '\0';
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_a0);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            puVar9 = (ulong *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar9) {
              local_e8.field_2._M_allocated_capacity = *puVar9;
              local_e8.field_2._8_8_ = plVar7[3];
            }
            else {
              local_e8.field_2._M_allocated_capacity = *puVar9;
              local_e8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_e8._M_string_length = plVar7[1];
            *plVar7 = (long)puVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_e8);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            psVar10 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_c8.field_2._M_allocated_capacity = *psVar10;
              local_c8.field_2._8_8_ = plVar7[3];
            }
            else {
              local_c8.field_2._M_allocated_capacity = *psVar10;
              local_c8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_c8._M_string_length = plVar7[1];
            *plVar7 = (long)psVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,local_a8->desc,&local_ea);
            pTVar6 = &deqp::gls::TextureStateQueryTests::createTexParamTest
                                (pTVar1,pRVar2,&local_c8,&local_70,QVar11,(GLenum)local_80,
                                 (TesterType)local_48)->super_TestNode;
            tcu::TestNode::addChild(local_50,pTVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,
                              CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                       local_a0.field_2._M_local_buf[0]) + 1);
            }
            lVar8 = lVar8 + 4;
          } while (lVar8 != 0x10);
        }
      }
      lVar8 = local_38 + 1;
    } while (lVar8 != 0x17);
    lVar8 = local_40 + 1;
  } while (lVar8 != 8);
  uVar4 = 1;
  lVar8 = 0;
  do {
    pTVar6 = local_78;
    local_50 = (TestNode *)CONCAT44(local_50._4_4_,uVar4);
    pTVar5 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,pTVar6->m_testCtx,init::pureSetters[lVar8].name,
               init::pureSetters[lVar8].desc);
    local_80 = pTVar5;
    tcu::TestNode::addChild(pTVar6,pTVar5);
    QVar11 = init::pureSetters[lVar8].verifier;
    lVar8 = 0x14;
    local_a8 = (anon_struct_24_4_699f403a *)CONCAT44(local_a8._4_4_,QVar11);
    do {
      if (QVar11 == QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER) {
        tester = *(TesterType *)((long)&init::pureStates[0].name + lVar8);
      }
      else {
        tester = TESTER_LAST;
        if (QVar11 == QUERY_TEXTURE_PARAM_PURE_INTEGER) {
          tester = *(TesterType *)(&init::pureSetters[1].field_0x14 + lVar8);
        }
      }
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      target = 0xde1;
      if (*(int *)(&init::pureSetters[1].field_0x14 + lVar8) == 0x13) {
        target = 0x806f;
      }
      pTVar1 = local_78->m_testCtx;
      pRVar2 = (RenderContext *)local_78[1]._vptr_TestNode[1];
      local_e8._M_string_length = 0;
      local_e8.field_2._M_allocated_capacity =
           local_e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_c8.field_2._M_allocated_capacity = *psVar10;
        local_c8.field_2._8_8_ = plVar7[3];
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar10;
        local_c8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_c8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,*(char **)((long)&init::pureSetters[1].desc + lVar8 + 4),
                 (allocator<char> *)&local_70);
      QVar11 = (QueryType)local_a8;
      pTVar6 = &deqp::gls::TextureStateQueryTests::createTexParamTest
                          (pTVar1,pRVar2,&local_c8,&local_a0,(QueryType)local_a8,target,tester)->
                super_TestNode;
      tcu::TestNode::addChild(local_80,pTVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,
                        CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                 local_a0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x1ac);
    lVar8 = 1;
    uVar4 = 0;
  } while (((ulong)local_50 & 1) != 0);
  return 0;
}

Assistant:

void TextureStateQueryTests::init (void)
{
	static const QueryType scalarVerifiers[] =
	{
		QUERY_TEXTURE_PARAM_INTEGER,
		QUERY_TEXTURE_PARAM_FLOAT,
		QUERY_TEXTURE_PARAM_PURE_INTEGER,
		QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER,
	};
	static const QueryType nonPureVerifiers[] =
	{
		QUERY_TEXTURE_PARAM_INTEGER,
		QUERY_TEXTURE_PARAM_FLOAT,
	};
	static const QueryType vec4Verifiers[] =
	{
		QUERY_TEXTURE_PARAM_INTEGER_VEC4,
		QUERY_TEXTURE_PARAM_FLOAT_VEC4,
		QUERY_TEXTURE_PARAM_PURE_INTEGER_VEC4,
		QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER_VEC4,
	};

#define FOR_EACH_VERIFIER(VERIFIERS, X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(VERIFIERS); ++verifierNdx)	\
	{																						\
		const char* verifierSuffix = getVerifierSuffix((VERIFIERS)[verifierNdx]);			\
		const QueryType verifier = (VERIFIERS)[verifierNdx];								\
		targetGroup->addChild(X);															\
	}

	static const struct
	{
		const char*	name;
		glw::GLenum	target;
		bool		newInGLES31;
	} textureTargets[] =
	{
		{ "texture_2d",						GL_TEXTURE_2D,						false,	},
		{ "texture_3d",						GL_TEXTURE_3D,						false,	},
		{ "texture_2d_array",				GL_TEXTURE_2D_ARRAY,				false,	},
		{ "texture_cube_map",				GL_TEXTURE_CUBE_MAP,				false,	},
		{ "texture_2d_multisample",			GL_TEXTURE_2D_MULTISAMPLE,			true,	},
		{ "texture_2d_multisample_array",	GL_TEXTURE_2D_MULTISAMPLE_ARRAY,	true,	}, // GL_OES_texture_storage_multisample_2d_array
		{ "texture_buffer",					GL_TEXTURE_BUFFER,					true,	}, // GL_EXT_texture_buffer
		{ "texture_cube_array",				GL_TEXTURE_CUBE_MAP_ARRAY,			true,	}, // GL_EXT_texture_cube_map_array
	};
	static const struct
	{
		const char*	name;
		const char*	desc;
		TesterType	tester;
		bool		newInGLES31;
	} states[] =
	{
		{ "texture_swizzle_r",				"TEXTURE_SWIZZLE_R",				TESTER_TEXTURE_SWIZZLE_R,				false	},
		{ "texture_swizzle_g",				"TEXTURE_SWIZZLE_G",				TESTER_TEXTURE_SWIZZLE_G,				false	},
		{ "texture_swizzle_b",				"TEXTURE_SWIZZLE_B",				TESTER_TEXTURE_SWIZZLE_B,				false	},
		{ "texture_swizzle_a",				"TEXTURE_SWIZZLE_A",				TESTER_TEXTURE_SWIZZLE_A,				false	},
		{ "texture_wrap_s",					"TEXTURE_WRAP_S",					TESTER_TEXTURE_WRAP_S,					false	},
		{ "texture_wrap_t",					"TEXTURE_WRAP_T",					TESTER_TEXTURE_WRAP_T,					false	},
		{ "texture_wrap_r",					"TEXTURE_WRAP_R",					TESTER_TEXTURE_WRAP_R,					false	},
		{ "texture_mag_filter",				"TEXTURE_MAG_FILTER",				TESTER_TEXTURE_MAG_FILTER,				false	},
		{ "texture_min_filter",				"TEXTURE_MIN_FILTER",				TESTER_TEXTURE_MIN_FILTER,				false	},
		{ "texture_min_lod",				"TEXTURE_MIN_LOD",					TESTER_TEXTURE_MIN_LOD,					false	},
		{ "texture_max_lod",				"TEXTURE_MAX_LOD",					TESTER_TEXTURE_MAX_LOD,					false	},
		{ "texture_base_level",				"TEXTURE_BASE_LEVEL",				TESTER_TEXTURE_BASE_LEVEL,				false	},
		{ "texture_max_level",				"TEXTURE_MAX_LEVEL",				TESTER_TEXTURE_MAX_LEVEL,				false	},
		{ "texture_compare_mode",			"TEXTURE_COMPARE_MODE",				TESTER_TEXTURE_COMPARE_MODE,			false	},
		{ "texture_compare_func",			"TEXTURE_COMPARE_FUNC",				TESTER_TEXTURE_COMPARE_FUNC,			false	},
		{ "texture_immutable_levels",		"TEXTURE_IMMUTABLE_LEVELS",			TESTER_TEXTURE_IMMUTABLE_LEVELS,		false	},
		{ "texture_immutable_format",		"TEXTURE_IMMUTABLE_FORMAT",			TESTER_TEXTURE_IMMUTABLE_FORMAT,		false	},
		{ "depth_stencil_mode",				"DEPTH_STENCIL_TEXTURE_MODE",		TESTER_DEPTH_STENCIL_TEXTURE_MODE,		true	},
		{ "texture_srgb_decode",			"TEXTURE_SRGB_DECODE_EXT",			TESTER_TEXTURE_SRGB_DECODE_EXT,			true	},
		{ "texture_border_color",			"TEXTURE_BORDER_COLOR",				TESTER_TEXTURE_BORDER_COLOR,			true	},
		{ "texture_wrap_s_clamp_to_border",	"TEXTURE_WRAP_S_CLAMP_TO_BORDER",	TESTER_TEXTURE_WRAP_S_CLAMP_TO_BORDER,	true	},
		{ "texture_wrap_t_clamp_to_border",	"TEXTURE_WRAP_T_CLAMP_TO_BORDER",	TESTER_TEXTURE_WRAP_T_CLAMP_TO_BORDER,	true	},
		{ "texture_wrap_r_clamp_to_border",	"TEXTURE_WRAP_R_CLAMP_TO_BORDER",	TESTER_TEXTURE_WRAP_R_CLAMP_TO_BORDER,	true	},
	};
	static const struct
	{
		const char* name;
		const char* desc;
		QueryType	verifier;
	} pureSetters[] =
	{
		{ "set_pure_int",	"Set state with pure int",			QUERY_TEXTURE_PARAM_PURE_INTEGER			},
		{ "set_pure_uint",	"Set state with pure unsigned int",	QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER	},
	};
	static const struct
	{
		const char*	name;
		const char*	desc;
		TesterType	intTester;
		TesterType	uintTester;
	} pureStates[] =
	{
		{ "texture_swizzle_r",				"TEXTURE_SWIZZLE_R",				TESTER_TEXTURE_SWIZZLE_R_SET_PURE_INT,			TESTER_TEXTURE_SWIZZLE_R_SET_PURE_UINT				},
		{ "texture_swizzle_g",				"TEXTURE_SWIZZLE_G",				TESTER_TEXTURE_SWIZZLE_G_SET_PURE_INT,			TESTER_TEXTURE_SWIZZLE_G_SET_PURE_UINT				},
		{ "texture_swizzle_b",				"TEXTURE_SWIZZLE_B",				TESTER_TEXTURE_SWIZZLE_B_SET_PURE_INT,			TESTER_TEXTURE_SWIZZLE_B_SET_PURE_UINT				},
		{ "texture_swizzle_a",				"TEXTURE_SWIZZLE_A",				TESTER_TEXTURE_SWIZZLE_A_SET_PURE_INT,			TESTER_TEXTURE_SWIZZLE_A_SET_PURE_UINT				},
		{ "texture_wrap_s",					"TEXTURE_WRAP_S",					TESTER_TEXTURE_WRAP_S_SET_PURE_INT,				TESTER_TEXTURE_WRAP_S_SET_PURE_UINT					},
		{ "texture_wrap_t",					"TEXTURE_WRAP_T",					TESTER_TEXTURE_WRAP_T_SET_PURE_INT,				TESTER_TEXTURE_WRAP_T_SET_PURE_UINT					},
		{ "texture_wrap_r",					"TEXTURE_WRAP_R",					TESTER_TEXTURE_WRAP_R_SET_PURE_INT,				TESTER_TEXTURE_WRAP_R_SET_PURE_UINT					},
		{ "texture_mag_filter",				"TEXTURE_MAG_FILTER",				TESTER_TEXTURE_MAG_FILTER_SET_PURE_INT,			TESTER_TEXTURE_MAG_FILTER_SET_PURE_UINT				},
		{ "texture_min_filter",				"TEXTURE_MIN_FILTER",				TESTER_TEXTURE_MIN_FILTER_SET_PURE_INT,			TESTER_TEXTURE_MIN_FILTER_SET_PURE_UINT				},
		{ "texture_min_lod",				"TEXTURE_MIN_LOD",					TESTER_TEXTURE_MIN_LOD_SET_PURE_INT,			TESTER_TEXTURE_MIN_LOD_SET_PURE_UINT				},
		{ "texture_max_lod",				"TEXTURE_MAX_LOD",					TESTER_TEXTURE_MAX_LOD_SET_PURE_INT,			TESTER_TEXTURE_MAX_LOD_SET_PURE_UINT				},
		{ "texture_base_level",				"TEXTURE_BASE_LEVEL",				TESTER_TEXTURE_BASE_LEVEL_SET_PURE_INT,			TESTER_TEXTURE_BASE_LEVEL_SET_PURE_UINT				},
		{ "texture_max_level",				"TEXTURE_MAX_LEVEL",				TESTER_TEXTURE_MAX_LEVEL_SET_PURE_INT,			TESTER_TEXTURE_MAX_LEVEL_SET_PURE_UINT				},
		{ "texture_compare_mode",			"TEXTURE_COMPARE_MODE",				TESTER_TEXTURE_COMPARE_MODE_SET_PURE_INT,		TESTER_TEXTURE_COMPARE_MODE_SET_PURE_UINT			},
		{ "texture_compare_func",			"TEXTURE_COMPARE_FUNC",				TESTER_TEXTURE_COMPARE_FUNC_SET_PURE_INT,		TESTER_TEXTURE_COMPARE_FUNC_SET_PURE_UINT			},
		// \note texture_immutable_levels is not settable
		// \note texture_immutable_format is not settable
		{ "depth_stencil_mode",				"DEPTH_STENCIL_TEXTURE_MODE",		TESTER_DEPTH_STENCIL_TEXTURE_MODE_SET_PURE_INT,	TESTER_DEPTH_STENCIL_TEXTURE_MODE_SET_PURE_UINT		},
		{ "texture_srgb_decode",			"TEXTURE_SRGB_DECODE_EXT",			TESTER_TEXTURE_SRGB_DECODE_EXT_SET_PURE_INT,	TESTER_TEXTURE_SRGB_DECODE_EXT_SET_PURE_UINT		},
		// \note texture_border_color is already checked
		// \note texture_wrap_*_clamp_to_border brings no additional coverage
	};

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(textureTargets); ++targetNdx)
	{
		tcu::TestCaseGroup* const targetGroup = new tcu::TestCaseGroup(m_testCtx, textureTargets[targetNdx].name, textureTargets[targetNdx].name);
		addChild(targetGroup);

		if (textureTargets[targetNdx].newInGLES31)
		{
			targetGroup->addChild(createIsTextureTest(m_testCtx,
													  m_context.getRenderContext(),
													  "is_texture",
													  "IsTexture",
													  textureTargets[targetNdx].target));
		}

		for (int stateNdx = 0; stateNdx < DE_LENGTH_OF_ARRAY(states); ++stateNdx)
		{
			if (!isLegalTesterForTarget(textureTargets[targetNdx].target, states[stateNdx].tester))
				continue;

			// for old targets, check only new states
			if (!textureTargets[targetNdx].newInGLES31 && !states[stateNdx].newInGLES31)
				continue;

			if (isExtendedParamQuery(states[stateNdx].tester))
			{
				// no need to cover for all getters if the only thing new is the param name
				FOR_EACH_VERIFIER(nonPureVerifiers, createTexParamTest(m_testCtx,
																	   m_context.getRenderContext(),
																	   std::string() + states[stateNdx].name + verifierSuffix,
																	   states[stateNdx].desc,
																	   verifier,
																	   textureTargets[targetNdx].target,
																	   states[stateNdx].tester));
			}
			else if (isIsVectorQuery(states[stateNdx].tester))
			{
				FOR_EACH_VERIFIER(vec4Verifiers, createTexParamTest(m_testCtx,
																	m_context.getRenderContext(),
																	std::string() + states[stateNdx].name + verifierSuffix,
																	states[stateNdx].desc,
																	verifier,
																	textureTargets[targetNdx].target,
																	states[stateNdx].tester));
			}
			else
			{
				FOR_EACH_VERIFIER(scalarVerifiers, createTexParamTest(m_testCtx,
																	  m_context.getRenderContext(),
																	  std::string() + states[stateNdx].name + verifierSuffix,
																	  states[stateNdx].desc,
																	  verifier,
																	  textureTargets[targetNdx].target,
																	  states[stateNdx].tester));
			}
		}
	}

#undef FOR_EACH_VERIFIER

	// set_pure_uint
	// set_pure_int
	for (int setterNdx = 0; setterNdx < DE_LENGTH_OF_ARRAY(pureSetters); ++setterNdx)
	{
		tcu::TestCaseGroup* const targetGroup = new tcu::TestCaseGroup(m_testCtx, pureSetters[setterNdx].name, pureSetters[setterNdx].desc);
		addChild(targetGroup);

		for (int stateNdx = 0; stateNdx < DE_LENGTH_OF_ARRAY(pureStates); ++stateNdx)
		{
			const TesterType	tester	= (pureSetters[setterNdx].verifier == QUERY_TEXTURE_PARAM_PURE_INTEGER)				? (pureStates[stateNdx].intTester)
										: (pureSetters[setterNdx].verifier == QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER)	? (pureStates[stateNdx].uintTester)
										: (TESTER_LAST);
			// need 3d texture to test R wrap
			const glw::GLenum	target	= (pureStates[stateNdx].intTester == TESTER_TEXTURE_WRAP_R_SET_PURE_INT) ? (GL_TEXTURE_3D) : (GL_TEXTURE_2D);

			targetGroup->addChild(createTexParamTest(m_testCtx,
													 m_context.getRenderContext(),
													 std::string() + pureStates[stateNdx].name,
													 pureStates[stateNdx].desc,
													 pureSetters[setterNdx].verifier,
													 target,
													 tester));
		}
	}
}